

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void sqlite3GenerateRowIndexDelete(Parse *pParse,Table *pTab,int iCur,int *aRegIdx)

{
  int p2;
  int p1;
  Index *pIdx;
  int *piVar1;
  
  pIdx = pTab->pIndex;
  if (pIdx != (Index *)0x0) {
    p1 = iCur + 1;
    piVar1 = aRegIdx;
    do {
      if ((aRegIdx == (int *)0x0) || (*piVar1 != 0)) {
        p2 = sqlite3GenerateIndexKey(pParse,pIdx,iCur,0,0);
        sqlite3VdbeAddOp3(pParse->pVdbe,0x62,p1,p2,pIdx->nColumn + 1);
      }
      pIdx = pIdx->pNext;
      p1 = p1 + 1;
      piVar1 = piVar1 + 1;
    } while (pIdx != (Index *)0x0);
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3GenerateRowIndexDelete(
  Parse *pParse,     /* Parsing and code generating context */
  Table *pTab,       /* Table containing the row to be deleted */
  int iCur,          /* Cursor number for the table */
  int *aRegIdx       /* Only delete if aRegIdx!=0 && aRegIdx[i]>0 */
){
  int i;
  Index *pIdx;
  int r1;

  for(i=1, pIdx=pTab->pIndex; pIdx; i++, pIdx=pIdx->pNext){
    if( aRegIdx!=0 && aRegIdx[i-1]==0 ) continue;
    r1 = sqlite3GenerateIndexKey(pParse, pIdx, iCur, 0, 0);
    sqlite3VdbeAddOp3(pParse->pVdbe, OP_IdxDelete, iCur+i, r1,pIdx->nColumn+1);
  }
}